

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

String __thiscall testing::internal::StreamableToString<char*>(internal *this,char **streamable)

{
  size_t extraout_RDX;
  String SVar2;
  Message local_20;
  size_t sVar1;
  
  Message::Message(&local_20);
  Message::operator<<(&local_20,streamable);
  SVar2 = Message::GetString((Message *)this);
  sVar1 = SVar2.length_;
  if (local_20.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_20.ss_ + 8))();
    sVar1 = extraout_RDX;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}